

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O0

void anon_unknown.dwarf_1d4887::writeRead
               (Array2D<unsigned_int> *pi1,Array2D<half> *ph1,Array2D<float> *pf1,char *fileName,
               LineOrder lorder,int width,int height,int xSize,int ySize,int xOffset,int yOffset,
               Compression comp,LevelMode mode,LevelRoundingMode rmode)

{
  LineOrder LVar1;
  Compression CVar2;
  PixelType PVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  void *pvVar9;
  LineOrder *pLVar10;
  Compression *pCVar11;
  uint *puVar12;
  half *phVar13;
  float *pfVar14;
  V2f *pVVar15;
  V2f *pVVar16;
  iterator this;
  InputFile *this_00;
  const_iterator fileName_00;
  char *pcVar17;
  char *pcVar18;
  Channel *pCVar19;
  char *in_RCX;
  Array2D<float> *in_RDX;
  Array2D<half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  LineOrder in_R8D;
  int in_R9D;
  float fVar20;
  float fVar21;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  Compression in_stack_00000030;
  LevelMode in_stack_00000038;
  LevelRoundingMode in_stack_00000040;
  int x_2;
  int y_5;
  ConstIterator ii_2;
  ConstIterator hi_2;
  FrameBuffer fb_3;
  int y_4;
  Array2D<float> pf2_2;
  Array2D<half> ph2_2;
  Array2D<unsigned_int> pi2_2;
  int dwy_2;
  int dwx_2;
  int h_2;
  int w_2;
  Box2i *dw_2;
  InputFile in_2;
  int x_1;
  int y_3;
  ConstIterator ii_1;
  ConstIterator hi_1;
  int y_2;
  FrameBuffer fb_2;
  Array2D<float> pf2_1;
  Array2D<half> ph2_1;
  Array2D<unsigned_int> pi2_1;
  int dwy_1;
  int dwx_1;
  int h_1;
  int w_1;
  Box2i *dw_1;
  InputFile in_1;
  int x;
  int y_1;
  ConstIterator ii;
  ConstIterator hi;
  int y;
  FrameBuffer fb_1;
  Array2D<float> pf2;
  Array2D<half> ph2;
  Array2D<unsigned_int> pi2;
  int dwy;
  int dwx;
  int h;
  int w;
  Box2i *dw;
  InputFile in;
  int tileX_2;
  int tileY_2;
  int xlevel;
  int ylevel;
  int tileX_1;
  int tileY_1;
  int level;
  int tileX;
  int tileY;
  int dy;
  int endTileY;
  int startTileY;
  TiledOutputFile out;
  FrameBuffer fb;
  Header hdr;
  int iVar22;
  undefined4 uVar23;
  int in_stack_fffffffffffff22c;
  undefined4 in_stack_fffffffffffff230;
  int ly;
  undefined4 uVar24;
  int in_stack_fffffffffffff234;
  undefined4 in_stack_fffffffffffff238;
  int dy_00;
  undefined4 uVar25;
  int in_stack_fffffffffffff23c;
  undefined4 in_stack_fffffffffffff240;
  float in_stack_fffffffffffff244;
  undefined8 in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff254;
  TileDescription *in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff260;
  undefined4 in_stack_fffffffffffff264;
  uint uVar26;
  Box2i *in_stack_fffffffffffff268;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  TiledOutputFile *in_stack_fffffffffffff3e0;
  int in_stack_fffffffffffff3ec;
  TiledOutputFile *in_stack_fffffffffffff3f0;
  undefined8 in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  char *in_stack_fffffffffffff468;
  undefined4 in_stack_fffffffffffff470;
  int in_stack_fffffffffffff474;
  char *in_stack_fffffffffffff478;
  InputFile *in_stack_fffffffffffff480;
  Slice *in_stack_fffffffffffff4d0;
  char *in_stack_fffffffffffff4d8;
  FrameBuffer *in_stack_fffffffffffff4e0;
  undefined7 in_stack_fffffffffffff4e8;
  undefined1 in_stack_fffffffffffff4ef;
  InputFile *in_stack_fffffffffffff4f0;
  FrameBuffer *in_stack_fffffffffffff778;
  TiledOutputFile *in_stack_fffffffffffff780;
  int local_6b8;
  int local_6b4;
  Slice local_680;
  Slice local_648;
  Slice local_610;
  int local_5a4;
  Array2D<float> local_5a0;
  Array2D<half> local_588;
  Array2D<unsigned_int> local_570;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  Box2i *local_548;
  InputFile local_540;
  int local_530;
  int local_52c;
  const_iterator local_528;
  iterator local_520;
  const_iterator local_510;
  iterator local_508;
  int local_4f4;
  Slice local_4f0;
  Slice local_4b8;
  Slice local_480;
  Array2D<float> local_418;
  Array2D<half> local_400;
  Array2D<unsigned_int> local_3e8;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  Box2i *local_3c0;
  InputFile local_3b8;
  int local_3a8;
  int local_3a4;
  const_iterator local_3a0;
  iterator local_398;
  const_iterator local_388;
  iterator local_380;
  int local_36c;
  Slice local_368;
  Slice local_330;
  Slice local_2f8;
  Array2D<float> local_290;
  Array2D<half> local_278;
  Array2D<unsigned_int> local_260;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  Box2i *local_238;
  InputFile local_230;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  TiledOutputFile local_1f0;
  Slice local_1d0;
  Slice local_198;
  Slice local_160;
  TileDescription local_f4;
  Channel local_e4;
  Channel local_d4;
  Channel local_c4;
  Vec2<float> local_a8;
  Vec2<int> local_a0;
  Vec2<int> local_98 [3];
  Vec2<int> local_80;
  Vec2<int> local_78 [10];
  int local_28;
  LineOrder local_24;
  char *local_20;
  Array2D<float> *local_18;
  Array2D<half> *local_10;
  Array2D<unsigned_int> *local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff458 >> 0x20);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar8 = std::operator<<((ostream *)&std::cout,"levelMode ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000038);
  poVar8 = std::operator<<(poVar8,", roundingMode ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000040);
  poVar8 = std::operator<<(poVar8,", line order ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_24);
  poVar8 = std::operator<<(poVar8,",\ntileSize ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000010);
  poVar8 = std::operator<<(poVar8,"x");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000018);
  poVar8 = std::operator<<(poVar8,", xOffset ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000020);
  poVar8 = std::operator<<(poVar8,", yOffset ");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,in_stack_00000028);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Vec2<int>::Vec2(local_78,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_80,local_28 + -1,in_stack_00000008 + -1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
  Imath_2_5::Vec2<int>::Vec2(local_98,in_stack_00000020,in_stack_00000028);
  Imath_2_5::Vec2<int>::Vec2
            (&local_a0,in_stack_00000020 + -1 + local_28,in_stack_00000028 + -1 + in_stack_00000008)
  ;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
  Imath_2_5::Vec2<float>::Vec2(&local_a8,0.0,0.0);
  Imf_2_5::Header::Header
            ((Header *)CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
             in_stack_fffffffffffff268,
             (Box2i *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             (float)((ulong)in_stack_fffffffffffff258 >> 0x20),
             (V2f *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
             (float)((ulong)in_stack_fffffffffffff248 >> 0x20),(LineOrder)in_stack_fffffffffffff248,
             (Compression)in_stack_fffffffffffff244);
  LVar1 = local_24;
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1f8f65);
  *pLVar10 = LVar1;
  pCVar11 = Imf_2_5::Header::compression((Header *)0x1f8f9b);
  *pCVar11 = in_stack_00000030;
  Imf_2_5::Header::channels((Header *)0x1f8fc3);
  Imf_2_5::Channel::Channel(&local_c4,UINT,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
             (Channel *)in_stack_fffffffffffff4d0);
  Imf_2_5::Header::channels((Header *)0x1f9014);
  Imf_2_5::Channel::Channel(&local_d4,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
             (Channel *)in_stack_fffffffffffff4d0);
  Imf_2_5::Header::channels((Header *)0x1f9064);
  Imf_2_5::Channel::Channel(&local_e4,FLOAT,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
             (Channel *)in_stack_fffffffffffff4d0);
  Imf_2_5::TileDescription::TileDescription
            (&local_f4,in_stack_00000010,in_stack_00000018,in_stack_00000038,in_stack_00000040);
  Imf_2_5::Header::setTileDescription
            ((Header *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258);
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1f90fa);
  puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](local_8,(long)-in_stack_00000028);
  Imf_2_5::Slice::Slice
            (&local_160,UINT,(char *)(puVar12 + -in_stack_00000020),4,(long)local_28 << 2,1,1,0.0,
             false,false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  phVar13 = Imf_2_5::Array2D<half>::operator[](local_10,(long)-in_stack_00000028);
  Imf_2_5::Slice::Slice
            (&local_198,HALF,(char *)(phVar13 + -in_stack_00000020),2,(long)local_28 * 2,1,1,0.0,
             false,false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  pfVar14 = Imf_2_5::Array2D<float>::operator[](local_18,(long)-in_stack_00000028);
  dy_00 = 0;
  ly = 0;
  iVar22 = 1;
  Imf_2_5::Slice::Slice
            (&local_1d0,FLOAT,(char *)(pfVar14 + -in_stack_00000020),4,(long)local_28 << 2,1,1,0.0,
             false,false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  poVar8 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  remove(local_20);
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff468,
             (Header *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),iVar7);
  Imf_2_5::TiledOutputFile::setFrameBuffer(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  local_1f4 = -1;
  local_1f8 = -1;
  switch(in_stack_00000038) {
  case ONE_LEVEL:
    if (local_24 == DECREASING_Y) {
      local_1f4 = Imf_2_5::TiledOutputFile::numYTiles
                            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
      local_1f4 = local_1f4 + -1;
      local_1f8 = -1;
      local_1fc = -1;
    }
    else {
      local_1f4 = 0;
      local_1f8 = Imf_2_5::TiledOutputFile::numYTiles
                            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
      local_1fc = 1;
    }
    for (local_200 = local_1f4; local_200 != local_1f8; local_200 = local_1fc + local_200) {
      for (local_204 = 0; iVar7 = local_204,
          iVar6 = Imf_2_5::TiledOutputFile::numXTiles
                            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec), iVar7 < iVar6;
          local_204 = local_204 + 1) {
        Imf_2_5::TiledOutputFile::writeTile
                  ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffff234,ly),
                   in_stack_fffffffffffff22c,iVar22,0);
      }
    }
    break;
  case MIPMAP_LEVELS:
    if (local_24 == DECREASING_Y) {
      local_1fc = -1;
    }
    else {
      local_1f4 = 0;
      local_1fc = 1;
    }
    local_1f8 = -1;
    for (local_208 = 0; iVar7 = local_208,
        iVar6 = Imf_2_5::TiledOutputFile::numLevels(in_stack_fffffffffffff3e0), iVar7 < iVar6;
        local_208 = local_208 + 1) {
      if (local_24 == DECREASING_Y) {
        local_1f4 = Imf_2_5::TiledOutputFile::numYTiles
                              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
        local_1f4 = local_1f4 + -1;
      }
      else {
        local_1f8 = Imf_2_5::TiledOutputFile::numYTiles
                              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
      }
      for (local_20c = local_1f4; local_20c != local_1f8; local_20c = local_1fc + local_20c) {
        for (local_210 = 0; iVar7 = local_210,
            iVar6 = Imf_2_5::TiledOutputFile::numXTiles
                              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec), iVar7 < iVar6;
            local_210 = local_210 + 1) {
          Imf_2_5::TiledOutputFile::writeTile
                    ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffff234,ly),
                     in_stack_fffffffffffff22c,iVar22,0);
        }
      }
    }
    break;
  case RIPMAP_LEVELS:
    for (local_214 = 0; iVar22 = local_214, iVar7 = Imf_2_5::TiledOutputFile::numYLevels(&local_1f0)
        , iVar22 < iVar7; local_214 = local_214 + 1) {
      if (local_24 == DECREASING_Y) {
        local_1f4 = Imf_2_5::TiledOutputFile::numYTiles
                              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
        local_1f4 = local_1f4 + -1;
        local_1f8 = -1;
        local_1fc = -1;
      }
      else {
        local_1f4 = 0;
        local_1f8 = Imf_2_5::TiledOutputFile::numYTiles
                              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
        local_1fc = 1;
      }
      for (local_218 = 0; iVar22 = local_218,
          iVar7 = Imf_2_5::TiledOutputFile::numXLevels(&local_1f0), iVar22 < iVar7;
          local_218 = local_218 + 1) {
        for (local_21c = local_1f4; local_21c != local_1f8; local_21c = local_1fc + local_21c) {
          for (local_220 = 0; iVar22 = local_220,
              iVar7 = Imf_2_5::TiledOutputFile::numXTiles
                                (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec),
              iVar22 < iVar7; local_220 = local_220 + 1) {
            Imf_2_5::TiledOutputFile::writeTile
                      ((TiledOutputFile *)
                       CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                       in_stack_fffffffffffff23c,dy_00,in_stack_fffffffffffff234,ly);
          }
        }
      }
    }
    break;
  case NUM_LEVELMODES:
  default:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Invalid tile mode ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,in_stack_00000038);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  Imf_2_5::TiledOutputFile::~TiledOutputFile
            ((TiledOutputFile *)CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270));
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1f998a);
  poVar8 = std::operator<<((ostream *)&std::cout," reading INCREASING_Y");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff474);
  Imf_2_5::InputFile::header(&local_230);
  local_238 = Imf_2_5::Header::dataWindow((Header *)0x1f9a1d);
  local_23c = ((local_238->max).x - (local_238->min).x) + 1;
  local_240 = ((local_238->max).y - (local_238->min).y) + 1;
  local_244 = (local_238->min).x;
  local_248 = (local_238->min).y;
  Imf_2_5::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,dy_00),CONCAT44(in_stack_fffffffffffff234,ly));
  Imf_2_5::Array2D<half>::Array2D
            ((Array2D<half> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,dy_00),CONCAT44(in_stack_fffffffffffff234,ly));
  Imf_2_5::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,dy_00),CONCAT44(in_stack_fffffffffffff234,ly));
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1f9af5);
  puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_260,(long)-local_248);
  Imf_2_5::Slice::Slice
            (&local_2f8,UINT,(char *)(puVar12 + -local_244),4,(long)local_23c << 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  phVar13 = Imf_2_5::Array2D<half>::operator[](&local_278,(long)-local_248);
  Imf_2_5::Slice::Slice
            (&local_330,HALF,(char *)(phVar13 + -local_244),2,(long)local_23c * 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_290,(long)-local_248);
  uVar25 = 0;
  uVar24 = 0;
  uVar23 = 1;
  Imf_2_5::Slice::Slice
            (&local_368,FLOAT,(char *)(pfVar14 + -local_244),4,(long)local_23c << 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  Imf_2_5::InputFile::setFrameBuffer
            (in_stack_fffffffffffff4f0,
             (FrameBuffer *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8));
  for (local_36c = (local_238->min).y; local_36c <= (local_238->max).y; local_36c = local_36c + 1) {
    Imf_2_5::InputFile::readPixels
              ((InputFile *)CONCAT44(in_stack_fffffffffffff234,uVar24),in_stack_fffffffffffff22c);
  }
  poVar8 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  Imf_2_5::InputFile::header(&local_230);
  Imf_2_5::Header::displayWindow((Header *)0x1f9de6);
  Imf_2_5::Header::displayWindow((Header *)0x1f9dfd);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
  if (!bVar4) {
    __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x127,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  Imf_2_5::Header::dataWindow((Header *)0x1f9e77);
  Imf_2_5::Header::dataWindow((Header *)0x1f9e8e);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
  if (!bVar4) {
    __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x128,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1f9f08);
  fVar20 = *pfVar14;
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1f9f34);
  if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
    __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x129,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  pVVar15 = Imf_2_5::Header::screenWindowCenter((Header *)0x1f9f9b);
  pVVar16 = Imf_2_5::Header::screenWindowCenter((Header *)0x1f9fb2);
  bVar4 = Imath_2_5::Vec2<float>::operator==(pVVar15,pVVar16);
  if (!bVar4) {
    __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1fa02c);
  fVar20 = *pfVar14;
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1fa058);
  if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
    __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,299,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1fa0bf);
  LVar1 = *pLVar10;
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1fa0e7);
  if (LVar1 != *pLVar10) {
    __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,300,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_230);
  pCVar11 = Imf_2_5::Header::compression((Header *)0x1fa149);
  CVar2 = *pCVar11;
  pCVar11 = Imf_2_5::Header::compression((Header *)0x1fa171);
  if (CVar2 != *pCVar11) {
    __assert_fail("in.header().compression() == hdr.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12d,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::Header::channels((Header *)0x1fa1bc);
  local_380._M_node =
       (_Base_ptr)
       Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
  Imf_2_5::ChannelList::ConstIterator::ConstIterator
            ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
             (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
  Imf_2_5::InputFile::header(&local_230);
  Imf_2_5::Header::channels((Header *)0x1fa228);
  local_388._M_node =
       (_Base_ptr)
       Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
  while( true ) {
    Imf_2_5::Header::channels((Header *)0x1fa266);
    local_398._M_node =
         (_Base_ptr)
         Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    Imf_2_5::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
               (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    bVar4 = Imf_2_5::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    if (!bVar4) break;
    pcVar17 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fa2e9);
    pcVar18 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fa300);
    iVar22 = strcmp(pcVar17,pcVar18);
    if (iVar22 != 0) {
      __assert_fail("!strcmp (hi.name(), ii.name())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x134,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa35b);
    PVar3 = pCVar19->type;
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa383);
    if (PVar3 != pCVar19->type) {
      __assert_fail("hi.channel().type == ii.channel().type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x135,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa3ce);
    iVar22 = pCVar19->xSampling;
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa3f7);
    if (iVar22 != pCVar19->xSampling) {
      __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x136,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa443);
    iVar22 = pCVar19->ySampling;
    pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fa46c);
    if (iVar22 != pCVar19->ySampling) {
      __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x137,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    Imf_2_5::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
  }
  Imf_2_5::InputFile::header(&local_230);
  Imf_2_5::Header::channels((Header *)0x1fa4f2);
  local_3a0._M_node =
       (_Base_ptr)
       Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
  bVar4 = Imf_2_5::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                              (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
  if (!bVar4) {
    __assert_fail("ii == in.header().channels().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x13d,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  for (local_3a4 = 0; local_3a4 < local_240; local_3a4 = local_3a4 + 1) {
    for (local_3a8 = 0; local_3a8 < local_23c; local_3a8 = local_3a8 + 1) {
      puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](local_8,(long)local_3a4);
      uVar26 = puVar12[local_3a8];
      puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_260,(long)local_3a4);
      if (uVar26 != puVar12[local_3a8]) {
        __assert_fail("pi1[y][x] == pi2[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x143,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      phVar13 = Imf_2_5::Array2D<half>::operator[](local_10,(long)local_3a4);
      fVar20 = half::operator_cast_to_float(phVar13 + local_3a8);
      phVar13 = Imf_2_5::Array2D<half>::operator[](&local_278,(long)local_3a4);
      fVar21 = half::operator_cast_to_float(phVar13 + local_3a8);
      if ((fVar20 != fVar21) || (NAN(fVar20) || NAN(fVar21))) {
        __assert_fail("ph1[y][x] == ph2[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x144,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pfVar14 = Imf_2_5::Array2D<float>::operator[](local_18,(long)local_3a4);
      fVar20 = pfVar14[local_3a8];
      pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_290,(long)local_3a4);
      if ((fVar20 != pfVar14[local_3a8]) || (NAN(fVar20) || NAN(pfVar14[local_3a8]))) {
        __assert_fail("pf1[y][x] == pf2[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x145,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
    }
  }
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1fa7aa);
  Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::InputFile::~InputFile
            ((InputFile *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"         reading DECREASING_Y");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff474);
  Imf_2_5::InputFile::header(&local_3b8);
  local_3c0 = Imf_2_5::Header::dataWindow((Header *)0x1fa88f);
  local_3c4 = ((local_3c0->max).x - (local_3c0->min).x) + 1;
  local_3c8 = ((local_3c0->max).y - (local_3c0->min).y) + 1;
  local_3cc = (local_3c0->min).x;
  local_3d0 = (local_3c0->min).y;
  Imf_2_5::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::Array2D<half>::Array2D
            ((Array2D<half> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
             CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24));
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1fa967);
  puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_3e8,(long)-local_3d0);
  Imf_2_5::Slice::Slice
            (&local_480,UINT,(char *)(puVar12 + -local_3cc),4,(long)local_3c4 << 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  phVar13 = Imf_2_5::Array2D<half>::operator[](&local_400,(long)-local_3d0);
  Imf_2_5::Slice::Slice
            (&local_4b8,HALF,(char *)(phVar13 + -local_3cc),2,(long)local_3c4 * 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_418,(long)-local_3d0);
  uVar25 = 0;
  uVar24 = 0;
  uVar23 = 1;
  Imf_2_5::Slice::Slice
            (&local_4f0,FLOAT,(char *)(pfVar14 + -local_3cc),4,(long)local_3c4 << 2,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  Imf_2_5::InputFile::setFrameBuffer
            (in_stack_fffffffffffff4f0,
             (FrameBuffer *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8));
  for (local_4f4 = (local_3c0->max).y; (local_3c0->min).y <= local_4f4; local_4f4 = local_4f4 + -1)
  {
    Imf_2_5::InputFile::readPixels
              ((InputFile *)CONCAT44(in_stack_fffffffffffff234,uVar24),in_stack_fffffffffffff22c);
  }
  poVar8 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  Imf_2_5::InputFile::header(&local_3b8);
  Imf_2_5::Header::displayWindow((Header *)0x1fac72);
  Imf_2_5::Header::displayWindow((Header *)0x1fac89);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
  if (!bVar4) {
    __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x176,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  Imf_2_5::Header::dataWindow((Header *)0x1fad03);
  Imf_2_5::Header::dataWindow((Header *)0x1fad1a);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
  if (!bVar4) {
    __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x177,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1fad94);
  fVar20 = *pfVar14;
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1fadc0);
  if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
    __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x178,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  pVVar15 = Imf_2_5::Header::screenWindowCenter((Header *)0x1fae27);
  pVVar16 = Imf_2_5::Header::screenWindowCenter((Header *)0x1fae3e);
  bVar4 = Imath_2_5::Vec2<float>::operator==(pVVar15,pVVar16);
  if (!bVar4) {
    __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x179,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1faeb8);
  fVar20 = *pfVar14;
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1faee4);
  if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
    __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x17a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1faf4b);
  LVar1 = *pLVar10;
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1faf73);
  if (LVar1 != *pLVar10) {
    __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x17b,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  Imf_2_5::InputFile::header(&local_3b8);
  pCVar11 = Imf_2_5::Header::compression((Header *)0x1fafd5);
  CVar2 = *pCVar11;
  pCVar11 = Imf_2_5::Header::compression((Header *)0x1faffd);
  if (CVar2 == *pCVar11) {
    Imf_2_5::Header::channels((Header *)0x1fb048);
    local_508._M_node =
         (_Base_ptr)
         Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    Imf_2_5::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
               (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    Imf_2_5::InputFile::header(&local_3b8);
    Imf_2_5::Header::channels((Header *)0x1fb0b4);
    local_510._M_node =
         (_Base_ptr)
         Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    while( true ) {
      Imf_2_5::Header::channels((Header *)0x1fb0f2);
      this._M_node = (_Base_ptr)
                     Imf_2_5::ChannelList::end
                               ((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      local_520._M_node = this._M_node;
      Imf_2_5::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                 (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      uVar5 = Imf_2_5::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      if (!(bool)uVar5) break;
      in_stack_fffffffffffff4e0 =
           (FrameBuffer *)Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fb175);
      in_stack_fffffffffffff4d8 =
           Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fb18c);
      iVar22 = strcmp((char *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      if (iVar22 != 0) {
        __assert_fail("!strcmp (hi.name(), ii.name())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x183,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      in_stack_fffffffffffff4d0 =
           (Slice *)Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb1e7);
      PVar3 = in_stack_fffffffffffff4d0->type;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb20f);
      if (PVar3 != pCVar19->type) {
        __assert_fail("hi.channel().type == ii.channel().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x184,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb25a);
      iVar22 = pCVar19->xSampling;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb283);
      if (iVar22 != pCVar19->xSampling) {
        __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x185,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb2cf);
      iVar22 = pCVar19->ySampling;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fb2f8);
      if (iVar22 != pCVar19->ySampling) {
        __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x186,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    }
    Imf_2_5::InputFile::header(&local_3b8);
    this_00 = (InputFile *)Imf_2_5::Header::channels((Header *)0x1fb37e);
    fileName_00._M_node =
         (_Base_ptr)
         Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    local_528._M_node = fileName_00._M_node;
    bVar4 = Imf_2_5::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    iVar22 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff474);
    if (!bVar4) {
      __assert_fail("ii == in.header().channels().end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x18c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    for (local_52c = 0; local_52c < local_3c8; local_52c = local_52c + 1) {
      for (local_530 = 0; local_530 < local_3c4; local_530 = local_530 + 1) {
        puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](local_8,(long)local_52c);
        uVar26 = puVar12[local_530];
        puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_3e8,(long)local_52c);
        if (uVar26 != puVar12[local_530]) {
          __assert_fail("pi1[y][x] == pi2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x192,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        phVar13 = Imf_2_5::Array2D<half>::operator[](local_10,(long)local_52c);
        fVar20 = half::operator_cast_to_float(phVar13 + local_530);
        phVar13 = Imf_2_5::Array2D<half>::operator[](&local_400,(long)local_52c);
        fVar21 = half::operator_cast_to_float(phVar13 + local_530);
        if ((fVar20 != fVar21) || (NAN(fVar20) || NAN(fVar21))) {
          __assert_fail("ph1[y][x] == ph2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x193,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        pfVar14 = Imf_2_5::Array2D<float>::operator[](local_18,(long)local_52c);
        fVar20 = pfVar14[local_530];
        pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_418,(long)local_52c);
        if ((fVar20 != pfVar14[local_530]) || (NAN(fVar20) || NAN(pfVar14[local_530]))) {
          __assert_fail("pf1[y][x] == pf2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x194,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
      }
    }
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1fb636);
    Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    Imf_2_5::Array2D<unsigned_int>::~Array2D
              ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    Imf_2_5::InputFile::~InputFile
              ((InputFile *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"         reading INCREASING_Y (new frame buffer on every line)"
                            );
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
    Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile(this_00,(char *)fileName_00._M_node,iVar22);
    Imf_2_5::InputFile::header(&local_540);
    local_548 = Imf_2_5::Header::dataWindow((Header *)0x1fb71b);
    local_54c = ((local_548->max).x - (local_548->min).x) + 1;
    local_550 = ((local_548->max).y - (local_548->min).y) + 1;
    local_554 = (local_548->min).x;
    local_558 = (local_548->min).y;
    Imf_2_5::Array2D<unsigned_int>::Array2D
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
               CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24)
              );
    Imf_2_5::Array2D<half>::Array2D
              ((Array2D<half> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
               CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24)
              );
    Imf_2_5::Array2D<float>::Array2D
              ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
               CONCAT44(in_stack_fffffffffffff23c,uVar25),CONCAT44(in_stack_fffffffffffff234,uVar24)
              );
    for (local_5a4 = (local_548->min).y; local_5a4 <= (local_548->max).y; local_5a4 = local_5a4 + 1)
    {
      Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1fb81d);
      puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_570,(long)(local_5a4 - local_558))
      ;
      Imf_2_5::Slice::Slice(&local_610,UINT,(char *)(puVar12 + -local_554),4,0,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      phVar13 = Imf_2_5::Array2D<half>::operator[](&local_588,(long)(local_5a4 - local_558));
      Imf_2_5::Slice::Slice(&local_648,HALF,(char *)(phVar13 + -local_554),2,0,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_5a0,(long)(local_5a4 - local_558));
      uVar25 = 0;
      uVar24 = 0;
      uVar23 = 1;
      Imf_2_5::Slice::Slice(&local_680,FLOAT,(char *)(pfVar14 + -local_554),4,0,1,1,0.0,false,false)
      ;
      Imf_2_5::FrameBuffer::insert
                (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      Imf_2_5::InputFile::setFrameBuffer
                ((InputFile *)this._M_node,(FrameBuffer *)CONCAT17(uVar5,in_stack_fffffffffffff4e8))
      ;
      Imf_2_5::InputFile::readPixels
                ((InputFile *)CONCAT44(in_stack_fffffffffffff234,uVar24),in_stack_fffffffffffff22c);
      Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1fb9f4);
    }
    poVar8 = std::operator<<((ostream *)&std::cout," comparing");
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
    Imf_2_5::InputFile::header(&local_540);
    Imf_2_5::Header::displayWindow((Header *)0x1fbafe);
    Imf_2_5::Header::displayWindow((Header *)0x1fbb15);
    bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                      ((Box<Imath_2_5::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                       (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
    if (!bVar4) {
      __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1c8,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    Imf_2_5::Header::dataWindow((Header *)0x1fbba8);
    Imf_2_5::Header::dataWindow((Header *)0x1fbbbf);
    bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                      ((Box<Imath_2_5::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                       (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff23c,uVar25));
    if (!bVar4) {
      __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1c9,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1fbc39);
    fVar20 = *pfVar14;
    pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1fbc65);
    if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
      __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1ca,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    pVVar15 = Imf_2_5::Header::screenWindowCenter((Header *)0x1fbccc);
    pVVar16 = Imf_2_5::Header::screenWindowCenter((Header *)0x1fbce3);
    bVar4 = Imath_2_5::Vec2<float>::operator==(pVVar15,pVVar16);
    if (!bVar4) {
      __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1cb,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1fbd5d);
    fVar20 = *pfVar14;
    pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x1fbd89);
    if ((fVar20 != *pfVar14) || (NAN(fVar20) || NAN(*pfVar14))) {
      __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1cc,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1fbdf0);
    LVar1 = *pLVar10;
    pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1fbe18);
    if (LVar1 != *pLVar10) {
      __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1cd,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::InputFile::header(&local_540);
    pCVar11 = Imf_2_5::Header::compression((Header *)0x1fbe7a);
    CVar2 = *pCVar11;
    pCVar11 = Imf_2_5::Header::compression((Header *)0x1fbea2);
    if (CVar2 != *pCVar11) {
      __assert_fail("in.header().compression() == hdr.compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x1ce,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    Imf_2_5::Header::channels((Header *)0x1fbeed);
    Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    Imf_2_5::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
               (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    Imf_2_5::InputFile::header(&local_540);
    Imf_2_5::Header::channels((Header *)0x1fbf59);
    Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
    while( true ) {
      Imf_2_5::Header::channels((Header *)0x1fbf97);
      Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      Imf_2_5::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                 (Iterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      bVar4 = Imf_2_5::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
      if (!bVar4) {
        Imf_2_5::InputFile::header(&local_540);
        Imf_2_5::Header::channels((Header *)0x1fc20b);
        Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
        bVar4 = Imf_2_5::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24),
                                    (ConstIterator *)CONCAT44(in_stack_fffffffffffff22c,uVar23));
        if (!bVar4) {
          __assert_fail("ii == in.header().channels().end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x1de,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        local_6b4 = 0;
        do {
          if (local_550 <= local_6b4) {
            Imf_2_5::Array2D<float>::~Array2D
                      ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
            Imf_2_5::Array2D<half>::~Array2D
                      ((Array2D<half> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
            Imf_2_5::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff234,uVar24));
            Imf_2_5::InputFile::~InputFile
                      ((InputFile *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
            remove(local_20);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            Imf_2_5::Header::~Header
                      ((Header *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
            return;
          }
          for (local_6b8 = 0; local_6b8 < local_54c; local_6b8 = local_6b8 + 1) {
            puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](local_8,(long)local_6b4);
            uVar26 = puVar12[local_6b8];
            puVar12 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_570,(long)local_6b4);
            if (uVar26 != puVar12[local_6b8]) {
              __assert_fail("pi1[y][x] == pi2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1e4,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            phVar13 = Imf_2_5::Array2D<half>::operator[](local_10,(long)local_6b4);
            fVar20 = half::operator_cast_to_float(phVar13 + local_6b8);
            phVar13 = Imf_2_5::Array2D<half>::operator[](&local_588,(long)local_6b4);
            fVar21 = half::operator_cast_to_float(phVar13 + local_6b8);
            if ((fVar20 != fVar21) || (NAN(fVar20) || NAN(fVar21))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1e5,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pfVar14 = Imf_2_5::Array2D<float>::operator[](local_18,(long)local_6b4);
            in_stack_fffffffffffff244 = pfVar14[local_6b8];
            pfVar14 = Imf_2_5::Array2D<float>::operator[](&local_5a0,(long)local_6b4);
            if ((in_stack_fffffffffffff244 != pfVar14[local_6b8]) ||
               (NAN(in_stack_fffffffffffff244) || NAN(pfVar14[local_6b8]))) {
              __assert_fail("pf1[y][x] == pf2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1e6,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
          }
          local_6b4 = local_6b4 + 1;
        } while( true );
      }
      pcVar17 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fc01a);
      pcVar18 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x1fc031);
      iVar22 = strcmp(pcVar17,pcVar18);
      if (iVar22 != 0) {
        __assert_fail("!strcmp (hi.name(), ii.name())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x1d5,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc08c);
      PVar3 = pCVar19->type;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc0b4);
      if (PVar3 != pCVar19->type) break;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc0ff);
      iVar22 = pCVar19->xSampling;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc128);
      if (iVar22 != pCVar19->xSampling) {
        __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x1d7,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc174);
      iVar22 = pCVar19->ySampling;
      pCVar19 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x1fc194);
      if (iVar22 != pCVar19->ySampling) {
        __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x1d8,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffff234,uVar24));
    }
    __assert_fail("hi.channel().type == ii.channel().type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x1d6,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  __assert_fail("in.header().compression() == hdr.compression()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                ,0x17c,
                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
               );
}

Assistant:

void
writeRead (const Array2D<unsigned int> &pi1,
           const Array2D<half> &ph1,
           const Array2D<float> &pf1,
           const char fileName[],
           LineOrder lorder,
           int width,
           int height,
           int xSize,
           int ySize,
           int xOffset,
           int yOffset,
           Compression comp,
           LevelMode mode,
	   LevelRoundingMode rmode)
{
    //
    // Write the pixel data in pi1, ph1 and ph2 to a tiled
    // image file using the specified parameters.
    // Read the pixel data back from the file using the scanline
    // interface one scanline at a time, and verify that the data did
    // not change.
    // For MIPMAP and RIPMAP_LEVELS, the lower levels of the images
    // are filled in cropped versions of the level(0,0) image,
    // i.e. no filtering is done.
    //

    cout << "levelMode " << mode <<
	    ", roundingMode " << rmode <<
            ", line order " << lorder <<
            ",\ntileSize " << xSize << "x" << ySize <<
            ", xOffset " << xOffset <<
            ", yOffset "<< yOffset << endl;

    Header hdr ((Box2i (V2i (0, 0),                     // display window
                        V2i (width - 1, height -1))),
                (Box2i (V2i (xOffset, yOffset),         // data window
                        V2i (xOffset + width - 1, yOffset + height - 1))));
    hdr.lineOrder() = lorder;
    hdr.compression() = comp;

    hdr.channels().insert ("I", Channel (IMF::UINT));
    hdr.channels().insert ("H", Channel (IMF::HALF));
    hdr.channels().insert ("F", Channel (IMF::FLOAT));
    
    hdr.setTileDescription(TileDescription(xSize, ySize, mode, rmode));
    {
        FrameBuffer fb; 

        fb.insert ("I",                                       // name
                   Slice (IMF::UINT,                          // type
                          (char *) &pi1[-yOffset][-xOffset],  // base
                          sizeof (pi1[0][0]),                 // xStride
                          sizeof (pi1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("H",                                       // name
                   Slice (IMF::HALF,                          // type
                          (char *) &ph1[-yOffset][-xOffset],  // base
                          sizeof (ph1[0][0]),                 // xStride
                          sizeof (ph1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("F",                                       // name
                   Slice (IMF::FLOAT,                              // type
                          (char *) &pf1[-yOffset][-xOffset],  // base
                          sizeof (pf1[0][0]),                 // xStride
                          sizeof (pf1[0][0]) * width)         // yStride
                  );

        cout << " writing" << flush;

        remove (fileName);
        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        
        int startTileY = -1;
	int endTileY = -1;
        int dy;

        switch (mode)
        {
          case ONE_LEVEL:
          {
            if (lorder == DECREASING_Y)
            {
                startTileY = out.numYTiles() - 1;
                endTileY = -1;

                dy = -1;
            }        
            else
            {
                startTileY = 0;
                endTileY = out.numYTiles();

                dy = 1;
            }

            for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                for (int tileX = 0; tileX < out.numXTiles(); ++tileX)         
                    out.writeTile (tileX, tileY);
          }
          break;

          case MIPMAP_LEVELS:
          {
            if (lorder == DECREASING_Y)
            {
                endTileY = -1;
                dy = -1;
            }        
            else
            {
                startTileY = 0;
                dy = 1;
            }

            for (int level = 0; level < out.numLevels(); ++level)
            {
                if (lorder == DECREASING_Y)
                    startTileY = out.numYTiles(level) - 1;
                else
                    endTileY = out.numYTiles(level);

                for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                    for (int tileX = 0; tileX < out.numXTiles(level); ++tileX)
                        out.writeTile (tileX, tileY, level);
            }
          }
          break;
          
          case RIPMAP_LEVELS:
          {
            for (int ylevel = 0; ylevel < out.numYLevels(); ++ylevel)
            {               
                if (lorder == DECREASING_Y)
                {
                    startTileY = out.numYTiles(ylevel) - 1;
                    endTileY = -1;

                    dy = -1;
                }        
                else
                {
                    startTileY = 0;
                    endTileY = out.numYTiles(ylevel);

                    dy = 1;
                }

                for (int xlevel = 0; xlevel < out.numXLevels(); ++xlevel)
                {
                    for (int tileY = startTileY; tileY != endTileY;
                         tileY += dy)
                        for (int tileX = 0; tileX < out.numXTiles (xlevel);
                             ++tileX)
                            out.writeTile (tileX, tileY, xlevel, ylevel);
                }
            }
          }
          break;
			case NUM_LEVELMODES:
			default:
				std::cerr << "Invalid tile mode " << int(mode) << std::endl;
				break;
        }
    }

    {
        cout << " reading INCREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.min.y; y <= dw.max.y; ++y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    {
        cout << endl << "         reading DECREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.max.y; y >= dw.min.y; --y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }
    }

    {
        cout << endl << "         reading INCREASING_Y "
		        "(new frame buffer on every line)" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        for (int y = dw.min.y; y <= dw.max.y; ++y)
	{
	    FrameBuffer fb;

	    fb.insert ("I",					// name
		       Slice (IMF::UINT,			// type
			      (char *) &pi2[y - dwy][-dwx],	// base
			      sizeof (pi2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("H",					// name
		       Slice (IMF::HALF,			// type
			      (char *) &ph2[y - dwy][-dwx],	// base
			      sizeof (ph2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("F",                     	        // name
		       Slice (IMF::FLOAT,			// type
			      (char *) &pf2[y - dwy][-dwx],	// base
			      sizeof (pf2[0][0]),		// xStride
			      0)				// yStride
		      );

	    in.setFrameBuffer (fb);
            in.readPixels (y);
	}

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    remove (fileName);
    cout << endl;
}